

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::IfcReinforcingElement(IfcReinforcingElement *this)

{
  IfcReinforcingElement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x190,"IfcReinforcingElement");
  IfcBuildingElementComponent::IfcBuildingElementComponent
            (&this->super_IfcBuildingElementComponent,&PTR_construction_vtable_24__00f235e8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingElement,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingElement,_1UL> *)
             &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158,
             &PTR_construction_vtable_24__00f23770);
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xf23490;
  *(undefined8 *)&this->field_0x190 = 0xf235d0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xf234b8;
  (this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf234e0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xf23508;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xf23530;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x138
       = 0xf23558;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.field_0x148
       = 0xf23580;
  *(undefined8 *)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 =
       0xf235a8;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcBuildingElementComponent).field_0x168);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}